

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEIDeriv1_Writer.cpp
# Opt level: O0

void __thiscall OSTEIDeriv1_Writer::Write_Permutations_(OSTEIDeriv1_Writer *this)

{
  GeneratorInfoBase *in_RDI;
  QAM am;
  undefined1 in_stack_00000826;
  undefined1 in_stack_00000827;
  QAM *in_stack_00000828;
  OSTEIDeriv1_Writer *in_stack_00000830;
  QAM *this_00;
  QAM local_38;
  
  this_00 = &local_38;
  GeneratorInfoBase::FinalAM(in_RDI);
  QAM::QAM(this_00,(QAM *)in_RDI);
  Write_Permute_(in_stack_00000830,in_stack_00000828,(bool)in_stack_00000827,(bool)in_stack_00000826
                );
  QAM::~QAM((QAM *)0x16d39c);
  QAM::QAM(this_00,(QAM *)in_RDI);
  Write_Permute_(in_stack_00000830,in_stack_00000828,(bool)in_stack_00000827,(bool)in_stack_00000826
                );
  QAM::~QAM((QAM *)0x16d3d1);
  QAM::QAM(this_00,(QAM *)in_RDI);
  Write_Permute_(in_stack_00000830,in_stack_00000828,(bool)in_stack_00000827,(bool)in_stack_00000826
                );
  QAM::~QAM((QAM *)0x16d406);
  QAM::~QAM((QAM *)0x16d413);
  return;
}

Assistant:

void OSTEIDeriv1_Writer::Write_Permutations_(void) const
{
    ///////////////////////////////////////////////////////////
    // Note that we never permute bra, ket. That would
    // affect vectorization since we only vectorize on the ket
    ///////////////////////////////////////////////////////////
    QAM am = info_.FinalAM();

    // permute 1,2
    Write_Permute_(am, true, false);

    // permute 3,4
    Write_Permute_(am, false, true);

    // permute 1,2 and 3,4
    Write_Permute_(am, true, true);
}